

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O2

string * deqp::gles31::Functional::anon_unknown_1::generateTessControlShader
                   (string *__return_storage_ptr__,ShaderType shaderType,
                   string *shaderUniformDeclarations,string *shaderBody)

{
  ostream *poVar1;
  char *__s;
  ostringstream tessControlShaderSource;
  
  if (shaderType < SHADERTYPE_LAST) {
    if ((0xbU >> (shaderType & 0x1f) & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tessControlShaderSource);
      poVar1 = std::operator<<(&tessControlShaderSource.
                                super_basic_ostream<char,_std::char_traits<char>_>,
                               "#version 310 es\n");
      poVar1 = std::operator<<(poVar1,"#extension GL_EXT_tessellation_shader : require\n");
      poVar1 = std::operator<<(poVar1,"layout (vertices=3) out;\n");
      poVar1 = std::operator<<(poVar1,"\n");
      poVar1 = std::operator<<(poVar1,"uniform highp int u_arrayNdx;\n\n");
      poVar1 = std::operator<<(poVar1,(string *)shaderUniformDeclarations);
      poVar1 = std::operator<<(poVar1,"\n");
      poVar1 = std::operator<<(poVar1,"void main (void)\n");
      poVar1 = std::operator<<(poVar1,"{\n");
      poVar1 = std::operator<<(poVar1,"\thighp vec4 color;\n\n");
      poVar1 = std::operator<<(poVar1,(string *)shaderBody);
      poVar1 = std::operator<<(poVar1,"\n");
      poVar1 = std::operator<<(poVar1,
                               "\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
                              );
      std::operator<<(poVar1,"}\n");
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tessControlShaderSource);
      return __return_storage_ptr__;
    }
    __s = 
    "#version 310 es\n#extension GL_EXT_tessellation_shader : require\nlayout (vertices=3) out;\n\nvoid main (void)\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
    ;
  }
  else {
    __s = glcts::fixed_sample_locations_values + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&tessControlShaderSource);
  return __return_storage_ptr__;
}

Assistant:

std::string generateTessControlShader (ShaderType shaderType, const std::string& shaderUniformDeclarations, const std::string& shaderBody)
{
	static const char* const s_simpleTessContorlShaderSource =	"#version 310 es\n"
																"#extension GL_EXT_tessellation_shader : require\n"
																"layout (vertices=3) out;\n"
																"\n"
																"void main (void)\n"
																"{\n"
																"	gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
																"}\n";

	switch (shaderType)
	{
		case SHADERTYPE_VERTEX:
		case SHADERTYPE_FRAGMENT:
		case SHADERTYPE_TESS_EVALUATION:
			return s_simpleTessContorlShaderSource;

		case SHADERTYPE_TESS_CONTROL:
		case SHADERTYPE_ALL:
		{
			std::ostringstream tessControlShaderSource;
			tessControlShaderSource <<	"#version 310 es\n"
									<<	"#extension GL_EXT_tessellation_shader : require\n"
									<<	"layout (vertices=3) out;\n"
									<<	"\n"
									<<	"uniform highp int u_arrayNdx;\n\n"
									<<	shaderUniformDeclarations << "\n"
									<<	"void main (void)\n"
									<<	"{\n"
									<<	"	highp vec4 color;\n\n"
									<<	shaderBody << "\n"
									<<	"	gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
									<<	"}\n";

			return tessControlShaderSource.str();
		}

		default:
			DE_ASSERT(false);
			return "";
	}
}